

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestCase::ClearResult(TestCase *this)

{
  TestResult *in_RDI;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *unaff_retaddr;
  
  TestResult::Clear(in_RDI);
  internal::
  ForEach<std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>,void(*)(testing::TestInfo*)>
            (unaff_retaddr,(_func_void_TestInfo_ptr *)in_RDI);
  return;
}

Assistant:

void TestCase::ClearResult() {
  ad_hoc_test_result_.Clear();
  ForEach(test_info_list_, TestInfo::ClearTestResult);
}